

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

int lys_check_id(lys_node *node,lys_node *parent,lys_module *module)

{
  LYS_NODE LVar1;
  LYS_NODE LVar2;
  uint uVar3;
  lys_node **pplVar4;
  lys_node *plVar5;
  lys_node *plVar6;
  lys_node_grp *plVar7;
  lys_node *plVar8;
  char *pcVar9;
  lys_node *plVar10;
  lys_node *plVar11;
  lys_node *plVar12;
  char *name;
  bool bVar13;
  bool bVar14;
  
  if (node == (lys_node *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                  ,0x211,
                  "int lys_check_id(struct lys_node *, struct lys_node *, struct lys_module *)");
  }
  if (parent == (lys_node *)0x0) {
    if (module == (lys_module *)0x0) {
      __assert_fail("module",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                    ,0x214,
                    "int lys_check_id(struct lys_node *, struct lys_node *, struct lys_module *)");
    }
  }
  else {
    module = parent->module;
  }
  if (module == (lys_module *)0x0) {
    module = (lys_module *)0x0;
  }
  else if ((module->field_0x40 & 1) != 0) {
    module = (lys_module *)module->data;
  }
  LVar1 = node->nodetype;
  uVar3 = LVar1 - LYS_CONTAINER;
  if (uVar3 < 0x40) {
    if ((0x808bUL >> ((ulong)uVar3 & 0x3f) & 1) != 0) goto LAB_00154c06;
    if ((ulong)uVar3 == 0x3f) {
      if (parent == (lys_node *)0x0) {
        pplVar4 = &module->data;
      }
      else {
        pplVar4 = lys_child(parent,LYS_CASE);
      }
      plVar6 = *pplVar4;
      while( true ) {
        if (plVar6 == (lys_node *)0x0) {
          return 0;
        }
        if ((((plVar6->nodetype & 0x807d) != LYS_UNKNOWN) && (plVar6->module == node->module)) &&
           (name = node->name, plVar6->name == name)) break;
        plVar6 = plVar6->next;
      }
      pcVar9 = "case";
      goto LAB_00154f6a;
    }
  }
  if (LVar1 != LYS_ANYDATA) {
    if (LVar1 != LYS_GROUPING) {
      return 0;
    }
    if (parent == (lys_node *)0x0) {
      plVar6 = module->data;
      bVar13 = false;
      bVar14 = false;
    }
    else {
      pplVar4 = lys_child(parent,LYS_GROUPING);
      bVar13 = *pplVar4 == (lys_node *)0x0;
      plVar6 = *pplVar4;
      if (bVar13) {
        plVar6 = parent;
      }
      bVar14 = parent->nodetype == LYS_EXT;
    }
    if (!bVar14) {
      name = node->name;
      plVar7 = lys_find_grouping_up(name,plVar6);
      if (plVar7 != (lys_node_grp *)0x0) {
        pcVar9 = "grouping";
LAB_00154f6a:
        ly_vlog(LYE_DUPID,LY_VLOG_LYS,node,pcVar9,name);
        return 1;
      }
    }
    if (bVar13 || plVar6 == (lys_node *)0x0) {
      return 0;
    }
    plVar8 = plVar6;
    plVar10 = (lys_node *)0x0;
    while( true ) {
      plVar5 = plVar6;
      if ((plVar10 != (lys_node *)0x0) && (plVar5 = plVar10, plVar8 == plVar10)) {
        return 0;
      }
      if ((plVar8->nodetype & (LYS_GROUPING|LYS_OUTPUT|LYS_INPUT|LYS_LIST|LYS_CHOICE|LYS_CONTAINER))
          != LYS_UNKNOWN) break;
LAB_00154ee3:
      plVar8 = plVar8->prev;
      plVar10 = plVar5;
      if (plVar8 == (lys_node *)0x0) {
        return 0;
      }
    }
    plVar10 = (lys_node *)0x0;
    do {
      plVar11 = plVar10;
      if (plVar10 == (lys_node *)0x0) {
        plVar11 = plVar8;
      }
      do {
        if ((plVar11->nodetype &
            (LYS_GROUPING|LYS_OUTPUT|LYS_INPUT|LYS_LIST|LYS_CHOICE|LYS_CONTAINER)) == LYS_UNKNOWN) {
          plVar10 = (lys_node *)0x0;
        }
        else {
          plVar10 = plVar11->child;
        }
        if (plVar10 == (lys_node *)0x0) {
          if (plVar11 == plVar8) {
LAB_00154ece:
            plVar10 = (lys_node *)0x0;
            break;
          }
          plVar10 = plVar11->next;
        }
        while (plVar10 == (lys_node *)0x0) {
          if (plVar11 == (lys_node *)0x0) {
LAB_00154e78:
            plVar10 = (lys_node *)0x0;
          }
          else {
            if (plVar11->nodetype == LYS_EXT) {
              if (plVar11->padding[1] != '\x01') goto LAB_00154e78;
              plVar10 = (lys_node *)plVar11->dsc;
            }
            else {
              plVar10 = plVar11->parent;
              if (plVar10 == (lys_node *)0x0) goto LAB_00154e78;
            }
            if (plVar10->nodetype == LYS_AUGMENT) {
              plVar10 = plVar10->prev;
            }
          }
          if (plVar10 == plVar8) goto LAB_00154ece;
          if (plVar11 == (lys_node *)0x0) {
LAB_00154eb1:
            plVar12 = (lys_node *)0x0;
          }
          else {
            if (plVar11->nodetype == LYS_EXT) {
              if (plVar11->padding[1] != '\x01') goto LAB_00154eb1;
              plVar12 = (lys_node *)plVar11->dsc;
            }
            else {
              plVar12 = plVar11->parent;
              if (plVar12 == (lys_node *)0x0) goto LAB_00154eb1;
            }
            if (plVar12->nodetype == LYS_AUGMENT) {
              plVar12 = plVar12->prev;
            }
          }
          plVar10 = plVar11->next;
          plVar11 = plVar12;
        }
        plVar11 = plVar10;
      } while (plVar10->nodetype != LYS_GROUPING);
      if (plVar10 == (lys_node *)0x0) goto LAB_00154ee3;
      name = node->name;
      if (name == plVar10->name) {
        pcVar9 = "grouping";
        goto LAB_00154f6a;
      }
    } while( true );
  }
LAB_00154c06:
  if (parent != (lys_node *)0x0) {
    do {
      LVar2 = parent->nodetype;
      if ((LVar2 & (LYS_AUGMENT|LYS_USES|LYS_CASE|LYS_CHOICE)) == LYS_UNKNOWN) {
LAB_00154c43:
        if (LVar2 == LYS_EXT) {
          pplVar4 = lys_child(parent,LVar1);
        }
        else {
          pplVar4 = &parent->child;
        }
        goto LAB_00154cc7;
      }
      if (LVar2 == LYS_AUGMENT) {
        plVar6 = parent->prev;
        if (plVar6 == (lys_node *)0x0) goto LAB_00154c43;
      }
      else {
        plVar6 = parent->parent;
      }
      parent = plVar6;
    } while (plVar6 != (lys_node *)0x0);
  }
  pplVar4 = &module->data;
  parent = (lys_node *)0x0;
LAB_00154cc7:
  plVar6 = *pplVar4;
  do {
    if (plVar6 == (lys_node *)0x0) {
      return 0;
    }
    LVar1 = plVar6->nodetype;
    if ((LVar1 & (LYS_USES|LYS_CASE)) == LYS_UNKNOWN) {
      if ((((LVar1 & (LYS_ANYDATA|LYS_LIST|LYS_LEAFLIST|LYS_LEAF|LYS_CHOICE|LYS_CONTAINER)) !=
            LYS_UNKNOWN) && (plVar6->module == node->module)) && (plVar6->name == node->name)) {
        pcVar9 = strnodetype(node->nodetype);
        name = node->name;
        goto LAB_00154f6a;
      }
      if (LVar1 == LYS_CHOICE) goto LAB_00154d01;
      if (plVar6->next == (lys_node *)0x0) {
        plVar10 = plVar6->parent;
        plVar8 = plVar6;
        while (plVar5 = plVar10, plVar6 = parent, plVar5 != parent) {
          if (plVar8 == (lys_node *)0x0) {
LAB_00154d53:
            plVar5 = (lys_node *)0x0;
          }
          else {
            if (plVar8->nodetype == LYS_EXT) {
              if (plVar8->padding[1] != '\x01') goto LAB_00154d53;
              plVar5 = (lys_node *)plVar8->dsc;
            }
            else if (plVar5 == (lys_node *)0x0) goto LAB_00154d53;
            if (plVar5->nodetype == LYS_AUGMENT) {
              plVar5 = plVar5->prev;
            }
          }
          plVar6 = plVar5;
          if (plVar5 == (lys_node *)0x0) {
            if (parent == (lys_node *)0x0) break;
          }
          else if ((plVar5 == parent) || (plVar5->next != (lys_node *)0x0)) break;
          plVar8 = plVar5;
          plVar10 = plVar5->parent;
        }
        if (plVar6 == parent) {
          return 0;
        }
      }
      pplVar4 = &plVar6->next;
    }
    else {
LAB_00154d01:
      pplVar4 = &plVar6->child;
    }
    plVar6 = *pplVar4;
  } while( true );
}

Assistant:

int
lys_check_id(struct lys_node *node, struct lys_node *parent, struct lys_module *module)
{
    struct lys_node *start, *stop, *iter;
    struct lys_node_grp *grp;
    int down, up;

    assert(node);

    if (!parent) {
        assert(module);
    } else {
        module = parent->module;
    }
    module = lys_main_module(module);

    switch (node->nodetype) {
    case LYS_GROUPING:
        /* 6.2.1, rule 6 */
        if (parent) {
            start = *lys_child(parent, LYS_GROUPING);
            if (!start) {
                down = 0;
                start = parent;
            } else {
                down = 1;
            }
            if (parent->nodetype == LYS_EXT) {
                up = 0;
            } else {
                up = 1;
            }
        } else {
            down = up = 1;
            start = module->data;
        }
        /* go up */
        if (up && lys_find_grouping_up(node->name, start)) {
            LOGVAL(LYE_DUPID, LY_VLOG_LYS, node, "grouping", node->name);
            return EXIT_FAILURE;
        }
        /* go down, because grouping can be defined after e.g. container in which is collision */
        if (down) {
            for (iter = start, stop = NULL; iter; iter = iter->prev) {
                if (!stop) {
                    stop = start;
                } else if (iter == stop) {
                    break;
                }
                if (!(iter->nodetype & (LYS_CONTAINER | LYS_CHOICE | LYS_LIST | LYS_GROUPING | LYS_INPUT | LYS_OUTPUT))) {
                    continue;
                }

                grp = NULL;
                while ((grp = lys_get_next_grouping(grp, iter))) {
                    if (ly_strequal(node->name, grp->name, 1)) {
                        LOGVAL(LYE_DUPID,LY_VLOG_LYS, node, "grouping", node->name);
                        return EXIT_FAILURE;
                    }
                }
            }
        }
        break;
    case LYS_LEAF:
    case LYS_LEAFLIST:
    case LYS_LIST:
    case LYS_CONTAINER:
    case LYS_CHOICE:
    case LYS_ANYDATA:
        /* 6.2.1, rule 7 */
        if (parent) {
            iter = parent;
            while (iter && (iter->nodetype & (LYS_USES | LYS_CASE | LYS_CHOICE | LYS_AUGMENT))) {
                if (iter->nodetype == LYS_AUGMENT) {
                    if (((struct lys_node_augment *)iter)->target) {
                        /* augment is resolved, go up */
                        iter = ((struct lys_node_augment *)iter)->target;
                        continue;
                    }
                    /* augment is not resolved, this is the final parent */
                    break;
                }
                iter = iter->parent;
            }

            if (!iter) {
                stop = NULL;
                iter = module->data;
            } else if (iter->nodetype == LYS_EXT) {
                stop = iter;
                iter = *lys_child(iter, node->nodetype);
            } else {
                stop = iter;
                iter = iter->child;
            }
        } else {
            stop = NULL;
            iter = module->data;
        }
        while (iter) {
            if (iter->nodetype & (LYS_USES | LYS_CASE)) {
                iter = iter->child;
                continue;
            }

            if (iter->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_LIST | LYS_CONTAINER | LYS_CHOICE | LYS_ANYDATA)) {
                if (iter->module == node->module && ly_strequal(iter->name, node->name, 1)) {
                    LOGVAL(LYE_DUPID, LY_VLOG_LYS, node, strnodetype(node->nodetype), node->name);
                    return EXIT_FAILURE;
                }
            }

            /* special case for choice - we must check the choice's name as
             * well as the names of nodes under the choice
             */
            if (iter->nodetype == LYS_CHOICE) {
                iter = iter->child;
                continue;
            }

            /* go to siblings */
            if (!iter->next) {
                /* no sibling, go to parent's sibling */
                do {
                    /* for parent LYS_AUGMENT */
                    if (iter->parent == stop) {
                        iter = stop;
                        break;
                    }
                    iter = lys_parent(iter);
                    if (iter && iter->next) {
                        break;
                    }
                } while (iter != stop);

                if (iter == stop) {
                    break;
                }
            }
            iter = iter->next;
        }
        break;
    case LYS_CASE:
        /* 6.2.1, rule 8 */
        if (parent) {
            start = *lys_child(parent, LYS_CASE);
        } else {
            start = module->data;
        }

        LY_TREE_FOR(start, iter) {
            if (!(iter->nodetype & (LYS_ANYDATA | LYS_CASE | LYS_CONTAINER | LYS_LEAF | LYS_LEAFLIST | LYS_LIST))) {
                continue;
            }

            if (iter->module == node->module && ly_strequal(iter->name, node->name, 1)) {
                LOGVAL(LYE_DUPID, LY_VLOG_LYS, node, "case", node->name);
                return EXIT_FAILURE;
            }
        }
        break;
    default:
        /* no check needed */
        break;
    }

    return EXIT_SUCCESS;
}